

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O1

int main(int argc,char **argv)

{
  PFNGLROTATEFPROC p_Var1;
  bool bVar2;
  int iVar3;
  time_t tVar4;
  GLFWmonitor **ppGVar5;
  GLFWvidmode *pGVar6;
  GLFWwindow *handle;
  char *pcVar7;
  int height;
  GLFWwindow *pGVar8;
  GLFWmonitor *handle_00;
  double dVar9;
  int monitorCount;
  int local_3c;
  double local_38;
  
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    bVar2 = false;
    while( true ) {
      if (bVar2) {
        handle_00 = (GLFWmonitor *)0x0;
      }
      else {
        ppGVar5 = glfwGetMonitors(&local_3c);
        iVar3 = rand();
        handle_00 = ppGVar5[iVar3 % local_3c];
      }
      if (handle_00 == (GLFWmonitor *)0x0) {
        iVar3 = 0x280;
        height = 0x1e0;
      }
      else {
        pGVar6 = glfwGetVideoMode(handle_00);
        iVar3 = pGVar6->width;
        height = pGVar6->height;
      }
      local_38 = glfwGetTime();
      handle = glfwCreateWindow(iVar3,height,"Window Re-opener",handle_00,(GLFWwindow *)0x0);
      pGVar8 = (GLFWwindow *)0x0;
      if (handle != (GLFWwindow *)0x0) {
        glfwMakeContextCurrent(handle);
        gladLoadGLLoader(glfwGetProcAddress);
        glfwSwapInterval(1);
        glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
        glfwSetWindowCloseCallback(handle,window_close_callback);
        glfwSetKeyCallback(handle,key_callback);
        pGVar8 = handle;
        if (handle_00 == (GLFWmonitor *)0x0) {
          dVar9 = glfwGetTime();
          printf("Opening regular window took %0.3f seconds\n",dVar9 - local_38);
        }
        else {
          pcVar7 = glfwGetMonitorName(handle_00);
          dVar9 = glfwGetTime();
          printf("Opening full screen window on monitor %s took %0.3f seconds\n",dVar9 - local_38,
                 pcVar7);
        }
      }
      if (pGVar8 == (GLFWwindow *)0x0) break;
      (*glad_glMatrixMode)(0x1701);
      (*glad_glOrtho)(-1.0,1.0,-1.0,1.0,1.0,-1.0);
      (*glad_glMatrixMode)(0x1700);
      glfwSetTime(0.0);
      while (dVar9 = glfwGetTime(), dVar9 < 5.0) {
        (*glad_glClear)(0x4000);
        (*glad_glPushMatrix)();
        p_Var1 = glad_glRotatef;
        dVar9 = glfwGetTime();
        (*p_Var1)((float)dVar9 * 100.0,0.0,0.0,1.0);
        (*glad_glRectf)(-0.5,-0.5,1.0,1.0);
        (*glad_glPopMatrix)();
        glfwSwapBuffers(pGVar8);
        glfwPollEvents();
        iVar3 = glfwWindowShouldClose(pGVar8);
        if (iVar3 != 0) {
          close_window(pGVar8);
          puts("User closed window");
          glfwTerminate();
          exit(0);
        }
      }
      puts("Closing window");
      close_window(pGVar8);
      bVar2 = (bool)(bVar2 ^ 1);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int count = 0;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (;;)
    {
        int width, height;
        GLFWmonitor* monitor = NULL;

        if (count % 2 == 0)
        {
            int monitorCount;
            GLFWmonitor** monitors = glfwGetMonitors(&monitorCount);
            monitor = monitors[rand() % monitorCount];
        }

        if (monitor)
        {
            const GLFWvidmode* mode = glfwGetVideoMode(monitor);
            width = mode->width;
            height = mode->height;
        }
        else
        {
            width = 640;
            height = 480;
        }

        window = open_window(width, height, monitor);
        if (!window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glMatrixMode(GL_PROJECTION);
        glOrtho(-1.f, 1.f, -1.f, 1.f, 1.f, -1.f);
        glMatrixMode(GL_MODELVIEW);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            glClear(GL_COLOR_BUFFER_BIT);

            glPushMatrix();
            glRotatef((GLfloat) glfwGetTime() * 100.f, 0.f, 0.f, 1.f);
            glRectf(-0.5f, -0.5f, 1.f, 1.f);
            glPopMatrix();

            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                close_window(window);
                printf("User closed window\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        printf("Closing window\n");
        close_window(window);

        count++;
    }

    glfwTerminate();
}